

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

char * test_and_fetch(char *fn)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  char *__filename;
  FILE *pFVar5;
  hFILE *fp;
  void *__dest;
  ssize_t sVar6;
  ulong uVar7;
  
  iVar1 = hisremote(fn);
  if (iVar1 == 0) {
    pFVar5 = fopen(fn,"rb");
    if (pFVar5 != (FILE *)0x0) {
      fclose(pFVar5);
      return fn;
    }
  }
  else {
    sVar3 = strlen(fn);
    pcVar4 = fn + sVar3;
    do {
      __filename = pcVar4;
      pcVar4 = __filename + -1;
      if (pcVar4 < fn) break;
    } while (*pcVar4 != '/');
    pFVar5 = fopen(__filename,"rb");
    if (pFVar5 != (FILE *)0x0) {
      fclose(pFVar5);
      return __filename;
    }
    fp = hopen(fn,"r");
    if (fp != (hFILE *)0x0) {
      pFVar5 = fopen(__filename,"w");
      if (pFVar5 != (FILE *)0x0) {
        if (2 < hts_verbose) {
          fprintf(_stderr,"[M::%s] downloading file \'%s\' to local directory\n","test_and_fetch",fn
                 );
        }
        __dest = calloc(0x100000,1);
        do {
          pcVar4 = fp->begin;
          uVar7 = (long)fp->end - (long)pcVar4;
          sVar3 = 0x100000;
          if (uVar7 < 0x100000) {
            sVar3 = uVar7;
          }
          memcpy(__dest,pcVar4,sVar3);
          fp->begin = pcVar4 + sVar3;
          uVar2 = 0x100000;
          if (uVar7 < 0x100000) {
            sVar6 = hread2(fp,__dest,0x100000,sVar3);
            uVar2 = (uint)sVar6;
            if ((int)uVar2 < 1) {
              free(__dest);
              fclose(pFVar5);
              iVar1 = hclose(fp);
              if (iVar1 != 0) {
                fprintf(_stderr,"[E::%s] fail to close remote file \'%s\'\n","test_and_fetch",fn);
              }
              return __filename;
            }
          }
          fwrite(__dest,1,(ulong)(uVar2 & 0x7fffffff),pFVar5);
        } while( true );
      }
      if (0 < hts_verbose) {
        fprintf(_stderr,"[E::%s] fail to create file \'%s\' in the working directory\n",
                "test_and_fetch",__filename);
      }
      hclose_abruptly(fp);
    }
  }
  return (char *)0x0;
}

Assistant:

static char *test_and_fetch(const char *fn)
{
    FILE *fp;
    if (hisremote(fn)) {
        const int buf_size = 1 * 1024 * 1024;
        hFILE *fp_remote;
        uint8_t *buf;
        int l;
        const char *p;
        for (p = fn + strlen(fn) - 1; p >= fn; --p)
            if (*p == '/') break;
        ++p; // p now points to the local file name
        // Attempt to open local file first
        if ((fp = fopen((char*)p, "rb")) != 0)
        {
            fclose(fp);
            return (char*)p;
        }
        // Attempt to open remote file. Stay quiet on failure, it is OK to fail when trying first .csi then .tbi index.
        if ((fp_remote = hopen(fn, "r")) == 0) return 0;
        if ((fp = fopen(p, "w")) == 0) {
            if (hts_verbose >= 1) fprintf(stderr, "[E::%s] fail to create file '%s' in the working directory\n", __func__, p);
            hclose_abruptly(fp_remote);
            return 0;
        }
        if (hts_verbose >= 3) fprintf(stderr, "[M::%s] downloading file '%s' to local directory\n", __func__, fn);
        buf = (uint8_t*)calloc(buf_size, 1);
        while ((l = hread(fp_remote, buf, buf_size)) > 0) fwrite(buf, 1, l, fp);
        free(buf);
        fclose(fp);
        if (hclose(fp_remote) != 0) fprintf(stderr, "[E::%s] fail to close remote file '%s'\n", __func__, fn);
        return (char*)p;
    } else {
        if ((fp = fopen(fn, "rb")) == 0) return 0;
        fclose(fp);
        return (char*)fn;
    }
}